

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::StreamingReporterBase<Catch::TestEventListenerBase>::testGroupStarting
          (StreamingReporterBase<Catch::TestEventListenerBase> *this,GroupInfo *_groupInfo)

{
  Option<Catch::GroupInfo>::operator=
            (&(this->currentGroupInfo).super_Option<Catch::GroupInfo>,_groupInfo);
  (this->currentGroupInfo).used = false;
  return;
}

Assistant:

void testGroupStarting(GroupInfo const& _groupInfo) override {
            currentGroupInfo = _groupInfo;
        }